

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

void ngram_model_set_map_words(ngram_model_t *base,char **words,int32 n_words)

{
  int32 iVar1;
  char **ppcVar2;
  logmath_t *plVar3;
  char *pcVar4;
  int local_30;
  int local_2c;
  int32 j;
  int32 i;
  ngram_model_set_t *set;
  int32 n_words_local;
  char **words_local;
  ngram_model_t *base_local;
  
  if (base->writable != '\0') {
    for (local_2c = 0; local_2c < base->n_words; local_2c = local_2c + 1) {
      ckd_free(base->word_str[local_2c]);
    }
  }
  ckd_free(base->word_str);
  ckd_free_2d(base[1].lmath);
  base->writable = '\x01';
  base->n_1g_alloc = n_words;
  base->n_words = n_words;
  ppcVar2 = (char **)__ckd_calloc__((long)n_words,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                    ,0x290);
  base->word_str = ppcVar2;
  plVar3 = (logmath_t *)
           __ckd_calloc_2d__((long)n_words,(long)base[1].refcount,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                             ,0x293);
  base[1].lmath = plVar3;
  hash_table_empty(base->wid);
  for (local_2c = 0; local_2c < n_words; local_2c = local_2c + 1) {
    pcVar4 = __ckd_salloc__(words[local_2c],
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x297);
    base->word_str[local_2c] = pcVar4;
    hash_table_enter(base->wid,base->word_str[local_2c],(void *)(long)local_2c);
    for (local_30 = 0; local_30 < base[1].refcount; local_30 = local_30 + 1) {
      iVar1 = ngram_wid(*(ngram_model_t **)(base[1].n_counts + (long)local_30 * 2),
                        base->word_str[local_2c]);
      *(int32 *)((long)(&((base[1].lmath)->t).table)[local_2c] + (long)local_30 * 4) = iVar1;
    }
  }
  return;
}

Assistant:

void
ngram_model_set_map_words(ngram_model_t * base,
                          const char **words, int32 n_words)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* Recreate the word mapping. */
    if (base->writable) {
        for (i = 0; i < base->n_words; ++i) {
            ckd_free(base->word_str[i]);
        }
    }
    ckd_free(base->word_str);
    ckd_free_2d((void **) set->widmap);
    base->writable = TRUE;
    base->n_words = base->n_1g_alloc = n_words;
    base->word_str = ckd_calloc(n_words, sizeof(*base->word_str));
    set->widmap =
        (int32 **) ckd_calloc_2d(n_words, set->n_models,
                                 sizeof(**set->widmap));
    hash_table_empty(base->wid);
    for (i = 0; i < n_words; ++i) {
        int32 j;
        base->word_str[i] = ckd_salloc(words[i]);
        (void) hash_table_enter_int32(base->wid, base->word_str[i], i);
        for (j = 0; j < set->n_models; ++j) {
            set->widmap[i][j] = ngram_wid(set->lms[j], base->word_str[i]);
        }
    }
}